

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Type __thiscall wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  uint32_t uVar2;
  BasicHeapType BVar3;
  Exactness EVar4;
  Type *pTVar5;
  uintptr_t *puVar6;
  HeapType HVar7;
  Nullability nullable;
  uint uVar8;
  Type local_78;
  Type local_70;
  Type subType;
  Iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Type local_38;
  Type type_local;
  
  local_38.id = type.id;
  if ((type.id & 1) == 0 || type.id < 7) {
    if ((type.id & 1) == 0 && 6 < type.id) {
      HVar7 = Type::getHeapType(&local_38);
      if ((this->funcContext != (FunctionCreationContext *)0x0) ||
         (type = local_38, ((uint)HVar7.id & 0x7b) != 0x48 || 0x7c < HVar7.id)) {
        subType.id = HVar7.id;
        bVar1 = Type::isExact(&local_38);
        if (bVar1) {
          if (((0x7c < HVar7.id) ||
              (uVar8 = (uint)HVar7.id & 0x7b, 4 < (uVar8 << 0x1d | uVar8 - 8 >> 3) - 10)) &&
             (uVar2 = Random::upTo(&this->random,0x14), uVar2 == 0)) {
            BVar3 = HeapType::getBottom((HeapType *)&subType);
            subType.id = (uintptr_t)BVar3;
          }
        }
        else {
          subType.id = (uintptr_t)getSubType(this,HVar7);
        }
        nullable = NonNullable;
        if ((((uint)local_38.id & 3) == 2 && 6 < local_38.id) &&
           ((((this->wasm->features).features & 0x400) == 0 ||
            (uVar2 = Random::upTo(&this->random,2), nullable = NonNullable, uVar2 != 0)))) {
          nullable = Nullable;
        }
        EVar4 = Type::getExactness(&local_38);
        Type::Type(&local_70,(HeapType)subType.id,nullable,(uint)(EVar4 == Exact));
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             local_70.id;
        if (((((local_70.id & 3) != 0 || local_70.id < 7) ||
             (HVar7 = Type::getHeapType((Type *)&__begin2.
                                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                                 .index), 0x7c < HVar7.id)) ||
            ((uVar8 = (uint)HVar7.id & 0x7b, 4 < (uVar8 << 0x1d | uVar8 - 8 >> 3) - 10 ||
             (((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                     local_38.id, (local_38.id & 3) == 0 && 6 < local_38.id &&
               (HVar7 = Type::getHeapType((Type *)&__begin2.
                                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                                  .index), HVar7.id < 0x7d)) &&
              (uVar8 = (uint)HVar7.id & 0x7b, (uVar8 << 0x1d | uVar8 - 8 >> 3) - 10 < 5)))))) ||
           (uVar2 = Random::upTo(&this->random,0x14), pTVar5 = &local_38, uVar2 == 0)) {
          pTVar5 = &local_70;
        }
        type.id = pTVar5->id;
      }
    }
    else if (6 < type.id) {
      __assert_fail("type.isBasic()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x15b9,"Type wasm::TranslateToFuzzReader::getSubType(Type)");
    }
  }
  else {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    subType.id = (uintptr_t)&local_38;
    pTVar5 = (Type *)Type::size(&local_38);
    if (pTVar5 != (Type *)0x0) {
      do {
        puVar6 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)&subType);
        local_70 = getSubType(this,*puVar6);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index,(iterator)0x0,&local_70);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)local_70;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                != pTVar5) || ((Type *)subType.id != &local_38));
    }
    wasm::Type::Type(&local_78,
                     (vector *)
                     &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
    type.id = local_78.id;
    if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
      operator_delete((void *)__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,
                      -__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index);
      type.id = local_78.id;
    }
  }
  return (Type)type.id;
}

Assistant:

Type TranslateToFuzzReader::getSubType(Type type) {
  if (type.isTuple()) {
    std::vector<Type> types;
    for (const auto& t : type) {
      types.push_back(getSubType(t));
    }
    return Type(types);
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    // Do not generate non-nullable exnrefs in global positions (they cannot be
    // created in wasm, nor imported from JS).
    if (!funcContext && heapType.isMaybeShared(HeapType::exn)) {
      return type;
    }
    if (type.isExact()) {
      // The only other possible heap type is bottom, but we don't want to
      // generate too many bottom types.
      if (!heapType.isBottom() && oneIn(20)) {
        heapType = heapType.getBottom();
      }
    } else {
      heapType = getSubType(heapType);
    }
    auto nullability = getSubType(type.getNullability());
    auto exactness = getSubType(type.getExactness());
    auto subType = Type(heapType, nullability, exactness);
    // We don't want to emit lots of uninhabitable types like (ref none), so
    // avoid them with high probability. Specifically, if the original type was
    // inhabitable then return that; avoid adding more uninhabitability.
    if (GCTypeUtils::isUninhabitable(subType) &&
        !GCTypeUtils::isUninhabitable(type) && !oneIn(20)) {
      return type;
    }
    return subType;
  } else {
    // This is an MVP type without subtypes.
    assert(type.isBasic());
    return type;
  }
}